

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int fits_img_decompress(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  FITSfile *pFVar1;
  void *array;
  int iVar2;
  uint uVar3;
  long lVar4;
  int datatype;
  long lVar5;
  int nrow;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  size_t __size;
  long lVar13;
  double *nulval;
  LONGLONG LVar14;
  long lVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int local_3fc;
  float fnulval;
  undefined4 local_3bc;
  long local_3b8;
  long local_3b0;
  long local_3a8;
  long local_3a0;
  fitsfile *local_398;
  void *local_390;
  LONGLONG local_388;
  long local_380;
  long local_378;
  long local_370;
  long local_368;
  long local_360;
  long local_358;
  long local_350;
  long local_348;
  long local_340;
  long local_338;
  long local_330;
  long local_328;
  long local_320;
  long local_318;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  undefined8 local_288;
  long local_280;
  long local_278;
  fitsfile *local_270;
  long local_268;
  long local_260;
  long ltile [6];
  long ftile [6];
  long tilesize [6];
  long naxis [6];
  long rowdim [6];
  long tlpixel [6];
  long tfpixel [6];
  double dnulval;
  LONGLONG fpixel [6];
  LONGLONG lpixel [6];
  long lpixel_1 [6];
  long fpixel_1 [6];
  
  iVar2 = fits_img_decompress_header(infptr,outfptr,status);
  if (0 < iVar2) goto LAB_00186323;
  ffrdef(outfptr,status);
  ffpscl(outfptr,1.0,0.0,status);
  ffpscl(infptr,1.0,0.0,status);
  pFVar1 = infptr->Fptr;
  iVar2 = pFVar1->zbitpix;
  nulval = (double *)&fnulval;
  if (iVar2 < 8) {
    if (iVar2 == -0x40) {
      nulval = &dnulval;
      dnulval = -9.1191291391491e-36;
      local_3fc = 1;
      uVar10 = 0x52;
    }
    else if (iVar2 == -0x20) {
      fnulval = -9.11912e-36;
      local_3fc = 1;
      uVar10 = 0x2a;
    }
    else {
LAB_0018624b:
      uVar10 = 0;
      local_3fc = 0;
    }
  }
  else {
    local_3fc = 0;
    if (iVar2 == 8) {
      uVar10 = 0xb;
    }
    else if (iVar2 == 0x20) {
      uVar10 = 0x1f;
    }
    else {
      if (iVar2 != 0x10) goto LAB_0018624b;
      uVar10 = 0x15;
    }
  }
  iVar2 = pFVar1->zndim;
  lVar5 = (long)iVar2;
  if (0 < lVar5) {
    memcpy(lpixel,pFVar1->znaxis,lVar5 * 8);
    lVar5 = lVar5 + -1;
    auVar17._8_4_ = (int)lVar5;
    auVar17._0_8_ = lVar5;
    auVar17._12_4_ = (int)((ulong)lVar5 >> 0x20);
    lVar5 = 0;
    auVar17 = auVar17 ^ _DAT_001cbc80;
    auVar18 = _DAT_001cbc70;
    do {
      auVar19 = auVar18 ^ _DAT_001cbc80;
      if ((bool)(~(auVar19._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar19._0_4_ ||
                  auVar17._4_4_ < auVar19._4_4_) & 1)) {
        *(undefined8 *)((long)fpixel + lVar5) = 1;
      }
      if ((auVar19._12_4_ != auVar17._12_4_ || auVar19._8_4_ <= auVar17._8_4_) &&
          auVar19._12_4_ <= auVar17._12_4_) {
        *(undefined8 *)((long)fpixel + lVar5 + 8) = 1;
      }
      lVar13 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 2;
      auVar18._8_8_ = lVar13 + 2;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(iVar2 + 1U >> 1) << 4 != lVar5);
  }
  if (0 < *status) goto LAB_00186323;
  iVar2 = fits_is_compressed_image(infptr,status);
  if (iVar2 == 0) {
    ffpmsg("CHDU is not a compressed image (fits_read_compressed_img)");
    *status = 0x19e;
    goto LAB_00186323;
  }
  uVar3 = (uint)uVar10;
  if (uVar3 < 0x28) {
    if (0x1d < uVar3) {
      if ((uVar3 != 0x1e) && (uVar3 != 0x1f)) goto LAB_001864b3;
LAB_0018647d:
      __size = infptr->Fptr->maxtilelen << 2;
LAB_0018648d:
      local_390 = malloc(__size);
      if (((*(char *)nulval != '\0') || (*(char *)((long)nulval + 1) != '\0')) ||
         (*(char *)((long)nulval + 2) != '\0')) goto LAB_001864e5;
      bVar16 = *(char *)((long)nulval + 3) == '\0';
      goto LAB_001864da;
    }
    if ((uVar3 != 0x14) && (uVar3 != 0x15)) goto LAB_001864b3;
    local_390 = malloc(infptr->Fptr->maxtilelen * 2);
    if (*(char *)nulval == '\0') {
      bVar16 = *(char *)((long)nulval + 1) == '\0';
      goto LAB_001864da;
    }
  }
  else {
    if (uVar3 < 0x2a) {
      if ((uVar3 == 0x28) || (uVar3 == 0x29)) {
        __size = infptr->Fptr->maxtilelen << 3;
        goto LAB_0018648d;
      }
    }
    else {
      if (uVar3 == 0x2a) goto LAB_0018647d;
      if (uVar3 == 0x52) {
        local_390 = malloc(infptr->Fptr->maxtilelen << 3);
        if ((((*(char *)nulval == '\0') && (*(char *)((long)nulval + 1) == '\0')) &&
            (*(char *)((long)nulval + 2) == '\0')) &&
           (((*(char *)((long)nulval + 3) == '\0' && (*(char *)((long)nulval + 4) == '\0')) &&
            ((*(char *)((long)nulval + 5) == '\0' &&
             ((*(char *)((long)nulval + 6) == '\0' && (*(char *)((long)nulval + 7) == '\0')))))))) {
          local_3fc = 0;
        }
        goto LAB_001864e5;
      }
    }
LAB_001864b3:
    if (1 < uVar3 - 0xb) {
      ffpmsg("unsupported datatype for uncompressing image");
      *status = 0x19a;
      goto LAB_00186323;
    }
    local_390 = malloc(infptr->Fptr->maxtilelen);
    bVar16 = *(char *)nulval == '\0';
LAB_001864da:
    if (bVar16) {
      local_3fc = 0;
    }
  }
LAB_001864e5:
  if (local_390 == (void *)0x0) {
    ffpmsg("Out of memory (fits_read_compress_img)");
    *status = 0x71;
  }
  else {
    lVar5 = 0;
    do {
      naxis[lVar5] = 1;
      naxis[lVar5 + 1] = 1;
      tilesize[lVar5] = 1;
      tilesize[lVar5 + 1] = 1;
      ftile[lVar5] = 1;
      ftile[lVar5 + 1] = 1;
      ltile[lVar5] = 1;
      ltile[lVar5 + 1] = 1;
      rowdim[lVar5] = 1;
      rowdim[lVar5 + 1] = 1;
      lVar5 = lVar5 + 2;
    } while (lVar5 != 6);
    pFVar1 = infptr->Fptr;
    iVar2 = pFVar1->zndim;
    if (0 < (long)iVar2) {
      lVar5 = 1;
      lVar13 = 0;
      do {
        lVar4 = *(long *)((long)fpixel + lVar13);
        lVar12 = *(long *)((long)lpixel + lVar13);
        lVar15 = lVar12;
        if (lVar4 < lVar12) {
          lVar15 = lVar4;
        }
        if (lVar12 < lVar4) {
          lVar12 = lVar4;
        }
        *(long *)((long)fpixel_1 + lVar13) = lVar15;
        *(long *)((long)lpixel_1 + lVar13) = lVar12;
        lVar4 = *(long *)((long)pFVar1->znaxis + lVar13);
        *(long *)((long)naxis + lVar13) = lVar4;
        if (lVar15 < 1) {
          free(local_390);
          *status = 0x141;
          goto LAB_00186323;
        }
        lVar12 = *(long *)((long)pFVar1->tilesize + lVar13);
        *(long *)((long)tilesize + lVar13) = lVar12;
        lVar11 = (lVar4 + -1) / lVar12 + 1;
        *(long *)((long)ftile + lVar13) = (lVar15 + -1) / lVar12 + 1;
        lVar4 = (*(long *)((long)lpixel_1 + lVar13) + -1) / lVar12 + 1;
        if (lVar11 <= lVar4) {
          lVar4 = lVar11;
        }
        *(long *)((long)ltile + lVar13) = lVar4;
        *(long *)((long)rowdim + lVar13) = lVar5;
        lVar5 = lVar5 * lVar11;
        lVar13 = lVar13 + 8;
      } while ((long)iVar2 * 8 != lVar13);
    }
    local_360 = ltile[5];
    local_398 = outfptr;
    local_270 = infptr;
    if (ftile[5] <= ltile[5]) {
      local_2a0 = ltile[0];
      local_2c0 = (ltile[0] - ftile[0]) + 1;
      iVar2 = ((int)ftile[2] + -1) * (int)rowdim[2] + ((int)ftile[3] + -1) * (int)rowdim[3] +
              ((int)ftile[4] + -1) * (int)rowdim[4] + ((int)ftile[5] + -1) * (int)rowdim[5] +
              ((int)ftile[1] + -1) * (int)rowdim[1] + (int)ftile[0];
      local_2c8 = ftile[0] * tilesize[0];
      local_298 = ftile[0];
      local_278 = tilesize[0];
      local_2d0 = (ftile[0] + -1) * tilesize[0];
      local_2d8 = -local_2d0;
      local_2d0 = local_2d0 + 1;
      local_370 = tilesize[5];
      local_378 = naxis[5];
      local_3b8 = ltile[4];
      local_340 = tilesize[4];
      local_348 = naxis[4];
      local_3b0 = ltile[3];
      local_318 = tilesize[3];
      local_320 = naxis[3];
      local_3a8 = ltile[2];
      local_2f0 = tilesize[2];
      local_2f8 = naxis[2];
      local_3a0 = ltile[1];
      local_2a8 = tilesize[1];
      local_280 = naxis[0];
      local_2b0 = naxis[1];
      lVar5 = 1;
      local_368 = ftile[4];
      local_338 = ftile[3];
      local_310 = ftile[2];
      local_2e8 = ftile[1];
      local_288 = uVar10;
      do {
        lVar13 = (ftile[5] + -1) * local_370;
        tlpixel[5] = ftile[5] * local_370;
        if (local_378 <= ftile[5] * local_370) {
          tlpixel[5] = local_378;
        }
        tfpixel[5] = lVar13 + 1;
        local_358 = ftile[5];
        if (local_368 <= local_3b8) {
          local_350 = tlpixel[5] - lVar13;
          lVar13 = local_368;
          iVar9 = iVar2;
          do {
            lVar4 = (lVar13 + -1) * local_340;
            tlpixel[4] = lVar13 * local_340;
            if (local_348 <= lVar13 * local_340) {
              tlpixel[4] = local_348;
            }
            tfpixel[4] = lVar4 + 1;
            local_330 = lVar13;
            if (ftile[3] <= local_3b0) {
              local_328 = (tlpixel[4] - lVar4) * local_350;
              iVar8 = iVar9;
              do {
                lVar13 = (ftile[3] + -1) * local_318;
                tlpixel[3] = ftile[3] * local_318;
                if (local_320 <= ftile[3] * local_318) {
                  tlpixel[3] = local_320;
                }
                tfpixel[3] = lVar13 + 1;
                local_308 = ftile[3];
                if (ftile[2] <= local_3a8) {
                  local_300 = (tlpixel[3] - lVar13) * local_328;
                  iVar7 = iVar8;
                  do {
                    lVar13 = (ftile[2] + -1) * local_2f0;
                    tlpixel[2] = ftile[2] * local_2f0;
                    if (local_2f8 <= ftile[2] * local_2f0) {
                      tlpixel[2] = local_2f8;
                    }
                    tfpixel[2] = lVar13 + 1;
                    local_2e0 = ftile[2];
                    if (ftile[1] <= local_3a0) {
                      local_2b8 = (tlpixel[2] - lVar13) * local_300;
                      iVar6 = iVar7;
                      do {
                        lVar13 = (ftile[1] + -1) * local_2a8;
                        tlpixel[1] = ftile[1] * local_2a8;
                        if (local_2b0 <= ftile[1] * local_2a8) {
                          tlpixel[1] = local_2b0;
                        }
                        tfpixel[1] = lVar13 + 1;
                        local_290 = ftile[1];
                        if (local_298 <= local_2a0) {
                          local_268 = (tlpixel[1] - lVar13) * local_2b8;
                          lVar13 = local_2c0;
                          lVar4 = local_2d8;
                          lVar12 = local_2d0;
                          lVar15 = local_2c8;
                          nrow = iVar6;
                          do {
                            array = local_390;
                            tlpixel[0] = lVar15;
                            if (local_280 < lVar15) {
                              tlpixel[0] = local_280;
                            }
                            lVar11 = (tlpixel[0] + lVar4) * local_268;
                            datatype = (int)uVar10;
                            local_388 = lVar5;
                            local_380 = lVar13;
                            local_260 = lVar12;
                            tfpixel[0] = lVar12;
                            imcomp_decompress_tile
                                      (local_270,nrow,(int)lVar11,datatype,local_3fc,nulval,
                                       local_390,(char *)0x0,&local_3bc,status);
                            LVar14 = local_388;
                            if (local_3bc == 0) {
                              ffpss(local_398,datatype,tfpixel,tlpixel,array,status);
                              LVar14 = local_388;
                            }
                            else {
                              ffppn(local_398,datatype,local_388,lVar11,array,nulval,status);
                              uVar10 = local_288;
                            }
                            lVar5 = LVar14 + lVar11;
                            nrow = nrow + 1;
                            lVar15 = lVar15 + local_278;
                            lVar4 = lVar4 - local_278;
                            lVar12 = local_260 + local_278;
                            lVar13 = local_380 + -1;
                          } while (lVar13 != 0);
                        }
                        ftile[1] = local_290 + 1;
                        iVar6 = iVar6 + (int)rowdim[1];
                      } while (local_290 != local_3a0);
                    }
                    ftile[2] = local_2e0 + 1;
                    iVar7 = iVar7 + (int)rowdim[2];
                    ftile[1] = local_2e8;
                  } while (local_2e0 != local_3a8);
                }
                ftile[3] = local_308 + 1;
                iVar8 = iVar8 + (int)rowdim[3];
                ftile[2] = local_310;
              } while (local_308 != local_3b0);
            }
            lVar13 = local_330 + 1;
            iVar9 = iVar9 + (int)rowdim[4];
            ftile[3] = local_338;
          } while (local_330 != local_3b8);
        }
        ftile[5] = local_358 + 1;
        iVar2 = iVar2 + (int)rowdim[5];
      } while (local_358 != local_360);
    }
    free(local_390);
  }
LAB_00186323:
  return *status;
}

Assistant:

int fits_img_decompress (fitsfile *infptr, /* image (bintable) to uncompress */
              fitsfile *outfptr,   /* empty HDU for output uncompressed image */
              int *status)         /* IO - error status               */

/* 
  This routine decompresses the whole image and writes it to the output file.
*/

{
    int ii, datatype = 0;
    int nullcheck, anynul;
    LONGLONG fpixel[MAX_COMPRESS_DIM], lpixel[MAX_COMPRESS_DIM];
    long inc[MAX_COMPRESS_DIM];
    long imgsize;
    float *nulladdr, fnulval;
    double dnulval;

    if (fits_img_decompress_header(infptr, outfptr, status) > 0)
    {
    	return (*status);
    }

    /* force a rescan of the output header keywords, then reset the scaling */
    /* in case the BSCALE and BZERO keywords are present, so that the       */
    /* decompressed values won't be scaled when written to the output image */
    ffrdef(outfptr, status);
    ffpscl(outfptr, 1.0, 0.0, status);
    ffpscl(infptr, 1.0, 0.0, status);

    /* initialize; no null checking is needed for integer images */
    nullcheck = 0;
    nulladdr =  &fnulval;

    /* determine datatype for image */
    if ((infptr->Fptr)->zbitpix == BYTE_IMG)
    {
        datatype = TBYTE;
    }
    else if ((infptr->Fptr)->zbitpix == SHORT_IMG)
    {
        datatype = TSHORT;
    }
    else if ((infptr->Fptr)->zbitpix == LONG_IMG)
    {
        datatype = TINT;
    }
    else if ((infptr->Fptr)->zbitpix == FLOAT_IMG)
    {
        /* In the case of float images we must check for NaNs  */
        nullcheck = 1;
        fnulval = FLOATNULLVALUE;
        nulladdr =  &fnulval;
        datatype = TFLOAT;
    }
    else if ((infptr->Fptr)->zbitpix == DOUBLE_IMG)
    {
        /* In the case of double images we must check for NaNs  */
        nullcheck = 1;
        dnulval = DOUBLENULLVALUE;
        nulladdr = (float *) &dnulval;
        datatype = TDOUBLE;
    }

    /* calculate size of the image (in pixels) */
    imgsize = 1;
    for (ii = 0; ii < (infptr->Fptr)->zndim; ii++)
    {
        imgsize *= (infptr->Fptr)->znaxis[ii];
        fpixel[ii] = 1;              /* Set first and last pixel to */
        lpixel[ii] = (infptr->Fptr)->znaxis[ii]; /* include the entire image. */
        inc[ii] = 1;
    }

    /* uncompress the input image and write to output image, one tile at a time */

    fits_read_write_compressed_img(infptr, datatype, fpixel, lpixel, inc,  
            nullcheck, nulladdr, &anynul, outfptr, status);

    return (*status);
}